

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

int __thiscall
capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
          (PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *this,EVP_PKEY_CTX *ctx)

{
  Schema SVar1;
  uint uVar2;
  ushort uVar3;
  Fault f;
  Schema local_60;
  Reader local_58;
  Schema local_28;
  
  local_60.raw = (RawBrandedSchema *)ctx;
  Schema::getProto(&local_58,&local_60);
  SVar1.raw = local_60.raw;
  if ((0xe0 < local_58._reader.dataSize) &&
     ((*(byte *)((long)local_58._reader.data + 0x1c) & 1) != 0)) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35]>
              ((Fault *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x76e,FAILED,"!schema.getProto().getStruct().getIsGroup()",
               "\"Cannot form pointer to group type.\"",
               (char (*) [35])"Cannot form pointer to group type.");
    kj::_::Debug::Fault::fatal((Fault *)&local_58);
  }
  local_28.raw = local_60.raw;
  Schema::getProto(&local_58,&local_28);
  uVar2 = 0;
  if (local_58._reader.dataSize < 0x80) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(ushort *)((long)local_58._reader.data + 0xe);
    if (0xcf < local_58._reader.dataSize) {
      uVar2 = (uint)*(ushort *)((long)local_58._reader.data + 0x18) << 0x10;
    }
  }
  PointerBuilder::initStruct
            ((StructBuilder *)(this + 8),(PointerBuilder *)&stack0x00000008,
             (StructSize)(uVar3 | uVar2));
  *(RawBrandedSchema **)this = SVar1.raw;
  return (int)this;
}

Assistant:

DynamicStruct::Builder PointerHelpers<DynamicStruct, Kind::OTHER>::init(
    PointerBuilder builder, StructSchema schema) {
  KJ_REQUIRE(!schema.getProto().getStruct().getIsGroup(),
             "Cannot form pointer to group type.");
  return DynamicStruct::Builder(schema,
      builder.initStruct(structSizeFromSchema(schema)));
}